

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_op_eval_bl(TCGContext_conflict8 *tcg_ctx,TCGv_i32 dst,TCGv_i32 src)

{
  TCGv_i32 reg;
  uintptr_t o;
  
  reg = tcg_temp_new_i64(tcg_ctx);
  gen_mov_reg_V(tcg_ctx,reg,src);
  gen_mov_reg_N(tcg_ctx,dst,src);
  tcg_gen_xor_i64_sparc64(tcg_ctx,dst,dst,reg);
  tcg_temp_free_internal_sparc64(tcg_ctx,(TCGTemp *)(reg + (long)tcg_ctx));
  return;
}

Assistant:

static inline void gen_op_eval_bl(TCGContext *tcg_ctx, TCGv dst, TCGv_i32 src)
{
    TCGv t0 = tcg_temp_new(tcg_ctx);
    gen_mov_reg_V(tcg_ctx, t0, src);
    gen_mov_reg_N(tcg_ctx, dst, src);
    tcg_gen_xor_tl(tcg_ctx, dst, dst, t0);
    tcg_temp_free(tcg_ctx, t0);
}